

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

string * makeTemp(string *__return_storage_ptr__,string *prefix)

{
  size_type sVar1;
  int iVar2;
  uint uVar3;
  char cVar4;
  ulong uVar5;
  
  sVar1 = prefix->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)sVar1 + '\b');
  for (uVar3 = 0; uVar5 = (ulong)uVar3, uVar5 < __return_storage_ptr__->_M_string_length;
      uVar3 = uVar3 + 1) {
    if (uVar5 < prefix->_M_string_length) {
      cVar4 = (prefix->_M_dataplus)._M_p[uVar5];
    }
    else {
      iVar2 = rand();
      cVar4 = (char)(iVar2 % 0x1a) + 'a';
    }
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar5] = cVar4;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string makeTemp(const std::string& prefix)
{
    std::string result(prefix.length() + 8, ' ');
    for (unsigned i = 0; i < result.length(); i++) {
        result[i] = i < prefix.length() ? prefix[i] : ('a' + (rand() % 26));
    }
    return result;
}